

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O3

void start_pass_phuff(j_compress_ptr cinfo,boolean gather_statistics)

{
  int iVar1;
  uint tblno;
  jpeg_entropy_encoder *pjVar2;
  jpeg_component_info *pjVar3;
  jpeg_error_mgr *pjVar4;
  int iVar5;
  code *pcVar6;
  _func_void_j_compress_ptr_boolean *p_Var7;
  long lVar8;
  
  pjVar2 = cinfo->entropy;
  pjVar2[3].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)cinfo;
  *(boolean *)&pjVar2[1].finish_pass = gather_statistics;
  iVar1 = cinfo->Ss;
  if (cinfo->Ah == 0) {
    pcVar6 = encode_mcu_AC_first;
    if (iVar1 == 0) {
      pcVar6 = encode_mcu_DC_first;
    }
    pjVar2->encode_mcu = pcVar6;
    iVar5 = jsimd_can_encode_mcu_AC_first_prepare();
    if (iVar5 == 0) {
      pcVar6 = encode_mcu_AC_first_prepare;
    }
    else {
      pcVar6 = jsimd_encode_mcu_AC_first_prepare;
    }
    pjVar2[1].start_pass = pcVar6;
  }
  else if (iVar1 == 0) {
    pjVar2->encode_mcu = encode_mcu_DC_refine;
  }
  else {
    pjVar2->encode_mcu = encode_mcu_AC_refine;
    iVar5 = jsimd_can_encode_mcu_AC_refine_prepare();
    if (iVar5 == 0) {
      pcVar6 = encode_mcu_AC_refine_prepare;
    }
    else {
      pcVar6 = jsimd_encode_mcu_AC_refine_prepare;
    }
    pjVar2[1].encode_mcu = pcVar6;
    if (pjVar2[5].start_pass == (_func_void_j_compress_ptr_boolean *)0x0) {
      p_Var7 = (_func_void_j_compress_ptr_boolean *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,1000);
      pjVar2[5].start_pass = p_Var7;
    }
  }
  pcVar6 = finish_pass_gather_phuff;
  if (gather_statistics == 0) {
    pcVar6 = finish_pass_phuff;
  }
  pjVar2->finish_pass = pcVar6;
  if (0 < cinfo->comps_in_scan) {
    lVar8 = 0;
    do {
      pjVar3 = cinfo->cur_comp_info[lVar8];
      *(undefined4 *)((long)&pjVar2[3].finish_pass + lVar8 * 4) = 0;
      if (iVar1 == 0) {
        if (cinfo->Ah == 0) {
          tblno = pjVar3->dc_tbl_no;
          goto LAB_0011c843;
        }
      }
      else {
        tblno = pjVar3->ac_tbl_no;
        *(uint *)&pjVar2[4].encode_mcu = tblno;
LAB_0011c843:
        if (gather_statistics == 0) {
          jpeg_make_c_derived_tbl
                    (cinfo,(uint)(iVar1 == 0),tblno,
                     (c_derived_tbl **)(&pjVar2[5].finish_pass + (int)tblno));
        }
        else {
          if (3 < tblno) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x32;
            (pjVar4->msg_parm).i[0] = tblno;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          p_Var7 = (&pjVar2[7].start_pass)[(int)tblno];
          if (p_Var7 == (_func_void_j_compress_ptr_boolean *)0x0) {
            p_Var7 = (_func_void_j_compress_ptr_boolean *)
                     (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x808);
            (&pjVar2[7].start_pass)[(int)tblno] = p_Var7;
          }
          memset(p_Var7,0,0x808);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < cinfo->comps_in_scan);
  }
  *(undefined8 *)((long)&pjVar2[4].encode_mcu + 4) = 0;
  pjVar2[2].finish_pass = (_func_void_j_compress_ptr *)0x0;
  *(undefined4 *)&pjVar2[3].start_pass = 0;
  *(uint *)&pjVar2[5].encode_mcu = cinfo->restart_interval;
  *(undefined4 *)((long)&pjVar2[5].encode_mcu + 4) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_phuff(j_compress_ptr cinfo, boolean gather_statistics)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  boolean is_DC_band;
  int ci, tbl;
  jpeg_component_info *compptr;

  entropy->cinfo = cinfo;
  entropy->gather_statistics = gather_statistics;

  is_DC_band = (cinfo->Ss == 0);

  /* We assume jcmaster.c already validated the scan parameters. */

  /* Select execution routines */
  if (cinfo->Ah == 0) {
    if (is_DC_band)
      entropy->pub.encode_mcu = encode_mcu_DC_first;
    else
      entropy->pub.encode_mcu = encode_mcu_AC_first;
    if (jsimd_can_encode_mcu_AC_first_prepare())
      entropy->AC_first_prepare = jsimd_encode_mcu_AC_first_prepare;
    else
      entropy->AC_first_prepare = encode_mcu_AC_first_prepare;
  } else {
    if (is_DC_band)
      entropy->pub.encode_mcu = encode_mcu_DC_refine;
    else {
      entropy->pub.encode_mcu = encode_mcu_AC_refine;
      if (jsimd_can_encode_mcu_AC_refine_prepare())
        entropy->AC_refine_prepare = jsimd_encode_mcu_AC_refine_prepare;
      else
        entropy->AC_refine_prepare = encode_mcu_AC_refine_prepare;
      /* AC refinement needs a correction bit buffer */
      if (entropy->bit_buffer == NULL)
        entropy->bit_buffer = (char *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      MAX_CORR_BITS * sizeof(char));
    }
  }
  if (gather_statistics)
    entropy->pub.finish_pass = finish_pass_gather_phuff;
  else
    entropy->pub.finish_pass = finish_pass_phuff;

  /* Only DC coefficients may be interleaved, so cinfo->comps_in_scan = 1
   * for AC coefficients.
   */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* Initialize DC predictions to 0 */
    entropy->last_dc_val[ci] = 0;
    /* Get table index */
    if (is_DC_band) {
      if (cinfo->Ah != 0)       /* DC refinement needs no table */
        continue;
      tbl = compptr->dc_tbl_no;
    } else {
      entropy->ac_tbl_no = tbl = compptr->ac_tbl_no;
    }
    if (gather_statistics) {
      /* Check for invalid table index */
      /* (make_c_derived_tbl does this in the other path) */
      if (tbl < 0 || tbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tbl);
      /* Allocate and zero the statistics tables */
      /* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
      if (entropy->count_ptrs[tbl] == NULL)
        entropy->count_ptrs[tbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->count_ptrs[tbl], 257 * sizeof(long));
    } else {
      /* Compute derived values for Huffman table */
      /* We may do this more than once for a table, but it's not expensive */
      jpeg_make_c_derived_tbl(cinfo, is_DC_band, tbl,
                              &entropy->derived_tbls[tbl]);
    }
  }

  /* Initialize AC stuff */
  entropy->EOBRUN = 0;
  entropy->BE = 0;

  /* Initialize bit buffer to empty */
  entropy->put_buffer = 0;
  entropy->put_bits = 0;

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}